

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-server.c
# Opt level: O2

int OpenSSL_verify_callback(int preverify_ok,X509_STORE_CTX *x509_ctx)

{
  int iVar1;
  X509 *x509;
  SSL *ssl;
  void *pvVar2;
  lws_tls_cert_info_results ir;
  
  x509 = X509_STORE_CTX_get_current_cert((X509_STORE_CTX *)x509_ctx);
  iVar1 = SSL_get_ex_data_X509_STORE_CTX_idx();
  ssl = (SSL *)X509_STORE_CTX_get_ex_data((X509_STORE_CTX *)x509_ctx,iVar1);
  pvVar2 = SSL_get_ex_data(ssl,openssl_websocket_private_data_index);
  iVar1 = lws_tls_openssl_cert_info((X509 *)x509,LWS_TLS_CERT_INFO_COMMON_NAME,&ir,0x40);
  if (iVar1 == 0) {
    _lws_log(8,"%s: client cert CN \'%s\'\n","OpenSSL_verify_callback",ir.ns.name);
  }
  else {
    _lws_log(8,"%s: couldn\'t get client cert CN\n","OpenSSL_verify_callback");
  }
  iVar1 = (**(code **)(*(long *)(*(long *)((long)pvVar2 + 0x200) + 0x1a0) + 8))
                    (pvVar2,0x17,x509_ctx,ssl,(long)preverify_ok);
  return (int)(iVar1 == 0);
}

Assistant:

static int
OpenSSL_verify_callback(int preverify_ok, X509_STORE_CTX *x509_ctx)
{
	SSL *ssl;
	int n;
	struct lws *wsi;
	union lws_tls_cert_info_results ir;
	X509 *topcert = X509_STORE_CTX_get_current_cert(x509_ctx);

	ssl = X509_STORE_CTX_get_ex_data(x509_ctx,
		SSL_get_ex_data_X509_STORE_CTX_idx());

	/*
	 * !!! nasty openssl requires the index to come as a library-scope
	 * static
	 */
	wsi = SSL_get_ex_data(ssl, openssl_websocket_private_data_index);

	n = lws_tls_openssl_cert_info(topcert, LWS_TLS_CERT_INFO_COMMON_NAME,
				      &ir, sizeof(ir.ns.name));
	if (!n)
		lwsl_info("%s: client cert CN '%s'\n", __func__, ir.ns.name);
	else
		lwsl_info("%s: couldn't get client cert CN\n", __func__);

	n = wsi->vhost->protocols[0].callback(wsi,
			LWS_CALLBACK_OPENSSL_PERFORM_CLIENT_CERT_VERIFICATION,
					   x509_ctx, ssl, preverify_ok);

	/* convert return code from 0 = OK to 1 = OK */
	return !n;
}